

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_image_function.cpp
# Opt level: O1

int main(void)

{
  Image imageIn2;
  Image imageIn1;
  Image imageOut;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&imageIn1,0x400,0x400,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&imageIn2,0x800,0x800,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&imageOut,0x200,0x200,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&imageIn1,0xff);
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&imageIn2,0x80);
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&imageOut,'\0');
  example1(&imageIn1,&imageIn2,&imageOut);
  example2(&imageIn1,&imageIn2,&imageOut);
  example3(&imageIn1,&imageIn2,&imageOut);
  Image_Function::BitwiseOr(&imageIn1,10,10,&imageIn2,0x28a,0x300,&imageOut,0,0,0x80,0x80);
  imageOut._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&imageOut);
  imageIn2._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&imageIn2);
  imageIn1._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&imageIn1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Application ended correctly.",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    // This example is to show how you can perform bitwise operations on gray-scale images
    //
    // Conditions:
    // We are in the middle of very serious image processing algorithm development
    //
    // We have 2 input images and 1 output image with known sizes:
    // - first input image is 1024 x 1024 pixels
    // - second input image is 2048 x 2048 pixels
    // - output image (where we would like to store results) is 512 x 512 pixel
    //
    // We have to make bitwise OR on 2 input images and store result in output image
    // We know that the area in first input image has coordinates { [10, 10], [138, 138] },
    // second input image - { [650, 768], [778, 896] },
    // and we need to put result into area { [0, 0], [128, 128] } in output image
    //
    // So let's do it!

    try // <---- do not forget to put your code into try.. catch block!
    {
        // create image objects with certain sizes

        PenguinV_Image::Image imageIn1( 1024, 1024 );
        PenguinV_Image::Image imageIn2( 2048, 2048 );
        PenguinV_Image::Image imageOut( 512, 512 );

        // set any data because initially images contain some uninitialized garbage
        // (we assume that this step you do not need to do during real development of image processing algorithms)
        imageIn1.fill( 255 );
        imageIn2.fill( 128 );
        imageOut.fill( 0 );

        // Now we need to make bitwise operation OR
        // First way to do
        example1( imageIn1, imageIn2, imageOut );

        // Second way to do
        example2( imageIn1, imageIn2, imageOut );

        // Third way to do
        example3( imageIn1, imageIn2, imageOut );

        // Forth way to do
        example4( imageIn1, imageIn2, imageOut );
    }
    catch( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << "Exception " << ex.what() << " raised. Closing the application..." << std::endl;
        return 1;
    }
    catch( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Closing the application..." << std::endl;
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}